

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O3

void nn_aipc_start(nn_aipc *self,nn_usock *listener)

{
  if (self->state == 1) {
    self->listener = listener;
    (self->listener_owner).src = 3;
    (self->listener_owner).fsm = &self->fsm;
    nn_usock_swap_owner(listener,&self->listener_owner);
    nn_fsm_start(&self->fsm);
    return;
  }
  nn_aipc_start_cold_1();
}

Assistant:

void nn_aipc_start (struct nn_aipc *self, struct nn_usock *listener)
{
#if defined NN_HAVE_WINDOWS
    size_t sz;
#endif
    nn_assert_state (self, NN_AIPC_STATE_IDLE);

    /*  Take ownership of the listener socket. */
    self->listener = listener;
    self->listener_owner.src = NN_AIPC_SRC_LISTENER;
    self->listener_owner.fsm = &self->fsm;
    nn_usock_swap_owner (listener, &self->listener_owner);

#if defined NN_HAVE_WINDOWS
    /* Get/Set security attribute pointer*/
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_SEC_ATTR, &self->usock.sec_attr, &sz);
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_OUTBUFSZ, &self->usock.outbuffersz, &sz);
    nn_ep_getopt (self->ep, NN_IPC, NN_IPC_INBUFSZ, &self->usock.inbuffersz, &sz);
#endif

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);
}